

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_Symbol_search(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue v;
  JSValue val_00;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue op2;
  JSValue op2_00;
  JSValue s;
  JSValue r;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  int iVar1;
  BOOL BVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValue index;
  JSValue result;
  JSValue currentLastIndex;
  JSValue previousLastIndex;
  JSValue str;
  JSValue rx;
  undefined4 in_stack_fffffffffffffdb8;
  JSAtom in_stack_fffffffffffffdbc;
  JSContext *in_stack_fffffffffffffdc0;
  JSValueUnion in_stack_fffffffffffffdc8;
  int64_t in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  JSContext *in_stack_fffffffffffffde0;
  JSValueUnion in_stack_fffffffffffffde8;
  int64_t in_stack_fffffffffffffdf0;
  JSValue in_stack_fffffffffffffdf8;
  JSContext *ctx_00;
  JSValueUnion in_stack_fffffffffffffe08;
  int64_t in_stack_fffffffffffffe10;
  JSValueUnion JVar6;
  int64_t iVar7;
  JSValueUnion local_100;
  JSAtom prop;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  JSValueUnion in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  int64_t in_stack_ffffffffffffff30;
  JSValueUnion local_a0;
  int64_t local_98;
  BOOL in_stack_ffffffffffffffb0;
  undefined4 uStack_4c;
  uint uStack_2c;
  uint uStack_c;
  
  JVar3.tag = in_RDX;
  JVar3.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar3);
  if (iVar1 == 0) {
    JVar3 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x173b95);
    return JVar3;
  }
  JVar4.u._4_4_ = in_stack_fffffffffffffdbc;
  JVar4.u.int32 = in_stack_fffffffffffffdb8;
  JVar4.tag = (int64_t)in_stack_fffffffffffffdc0;
  JVar3 = JS_ToString((JSContext *)0x173c6b,JVar4);
  iVar1 = JS_IsException(JVar3);
  if (iVar1 == 0) {
    obj.tag = in_stack_ffffffffffffff30;
    obj.u.float64 = in_stack_ffffffffffffff28.float64;
    JVar5.tag = in_stack_ffffffffffffff20;
    JVar5.u.float64 = in_stack_ffffffffffffff18.float64;
    JVar3 = JS_GetPropertyInternal
                      ((JSContext *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       obj,prop,JVar5,in_stack_ffffffffffffffb0);
    iVar1 = JS_IsException(JVar3);
    ctx_00 = (JSContext *)in_stack_fffffffffffffdf8.tag;
    if (iVar1 == 0) {
      JVar6.ptr = (void *)((ulong)uStack_c << 0x20);
      iVar7 = 0;
      op2.tag = in_stack_fffffffffffffdf0;
      op2.u.float64 = in_stack_fffffffffffffde8.float64;
      BVar2 = js_same_value(in_stack_fffffffffffffde0,in_stack_fffffffffffffdf8,op2);
      if (BVar2 == 0) {
        in_stack_fffffffffffffe08.ptr = (void *)((ulong)uStack_2c << 0x20);
        in_stack_fffffffffffffe10 = 0;
        this_obj.u._4_4_ = in_stack_fffffffffffffddc;
        this_obj.u.int32 = in_stack_fffffffffffffdd8;
        this_obj.tag = (int64_t)in_stack_fffffffffffffde0;
        val.tag = in_stack_fffffffffffffdd0;
        val.u.ptr = in_stack_fffffffffffffdc8.ptr;
        iVar1 = JS_SetProperty(in_stack_fffffffffffffdc0,this_obj,in_stack_fffffffffffffdbc,val);
        if (iVar1 < 0) goto LAB_0017421a;
      }
      r.tag = iVar7;
      r.u.ptr = JVar6.ptr;
      s.tag = in_stack_fffffffffffffe10;
      s.u.float64 = in_stack_fffffffffffffe08.float64;
      JVar4 = JS_RegExpExec(ctx_00,r,s);
      JVar3 = JVar4;
      iVar1 = JS_IsException(JVar4);
      if (iVar1 == 0) {
        obj_00.tag = in_stack_ffffffffffffff30;
        obj_00.u.float64 = in_stack_ffffffffffffff28.float64;
        this_obj_01.tag = in_stack_ffffffffffffff20;
        this_obj_01.u.float64 = in_stack_ffffffffffffff18.float64;
        JVar5 = JS_GetPropertyInternal
                          ((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),obj_00,prop
                           ,this_obj_01,in_stack_ffffffffffffffb0);
        local_a0 = JVar5.u;
        local_98 = JVar5.tag;
        iVar1 = JS_IsException(JVar5);
        if (iVar1 == 0) {
          op2_00.tag = local_98;
          op2_00.u.float64 = local_a0.float64;
          BVar2 = js_same_value(in_stack_fffffffffffffde0,JVar3,op2_00);
          if (BVar2 == 0) {
            this_obj_00.u._4_4_ = in_stack_fffffffffffffddc;
            this_obj_00.u.int32 = in_stack_fffffffffffffdd8;
            this_obj_00.tag = (int64_t)in_stack_fffffffffffffde0;
            val_00.tag = in_stack_fffffffffffffdd0;
            val_00.u.ptr = in_stack_fffffffffffffdc8.ptr;
            iVar1 = JS_SetProperty(in_stack_fffffffffffffdc0,this_obj_00,in_stack_fffffffffffffdbc,
                                   val_00);
            if (iVar1 < 0) goto LAB_0017421a;
          }
          else {
            v.tag = in_stack_fffffffffffffdd0;
            v.u.ptr = in_stack_fffffffffffffdc8.ptr;
            JS_FreeValue(in_stack_fffffffffffffdc0,v);
          }
          v_00.tag = in_stack_fffffffffffffdd0;
          v_00.u.ptr = in_stack_fffffffffffffdc8.ptr;
          JS_FreeValue(in_stack_fffffffffffffdc0,v_00);
          v_01.tag = in_stack_fffffffffffffdd0;
          v_01.u.ptr = in_stack_fffffffffffffdc8.ptr;
          JS_FreeValue(in_stack_fffffffffffffdc0,v_01);
          iVar1 = JS_IsNull(JVar4);
          if (iVar1 != 0) {
            local_100._4_4_ = uStack_4c;
            local_100.int32 = 0xffffffff;
            stack0xffffffffffffff08 = 0;
            return _local_100;
          }
          obj_01.tag = in_stack_ffffffffffffff30;
          obj_01.u = (JSValueUnion)(JSValueUnion)JVar4.tag;
          this_obj_02.tag = (int64_t)JVar4.u.ptr;
          this_obj_02.u.float64 = in_RDI.float64;
          JVar3 = JS_GetPropertyInternal
                            ((JSContext *)CONCAT44(0x57,in_stack_ffffffffffffff10),obj_01,prop,
                             this_obj_02,in_stack_ffffffffffffffb0);
          JS_FreeValue(in_stack_fffffffffffffdc0,JVar3);
          return JVar3;
        }
      }
    }
  }
LAB_0017421a:
  v_02.tag = in_stack_fffffffffffffdd0;
  v_02.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_02);
  v_03.tag = in_stack_fffffffffffffdd0;
  v_03.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_03);
  v_04.tag = in_stack_fffffffffffffdd0;
  v_04.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_04);
  v_05.tag = in_stack_fffffffffffffdd0;
  v_05.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_05);
  local_100.ptr = (void *)(local_100 << 0x20);
  stack0xffffffffffffff08 = 6;
  return _local_100;
}

Assistant:

static JSValue js_regexp_Symbol_search(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst rx = this_val;
    JSValue str, previousLastIndex, currentLastIndex, result, index;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    result = JS_UNDEFINED;
    currentLastIndex = JS_UNDEFINED;
    previousLastIndex = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;

    previousLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(previousLastIndex))
        goto exception;

    if (!js_same_value(ctx, previousLastIndex, JS_NewInt32(ctx, 0))) {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0) {
            goto exception;
        }
    }
    result = JS_RegExpExec(ctx, rx, str);
    if (JS_IsException(result))
        goto exception;
    currentLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(currentLastIndex))
        goto exception;
    if (js_same_value(ctx, currentLastIndex, previousLastIndex)) {
        JS_FreeValue(ctx, previousLastIndex);
    } else {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, previousLastIndex) < 0) {
            previousLastIndex = JS_UNDEFINED;
            goto exception;
        }
    }
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);

    if (JS_IsNull(result)) {
        return JS_NewInt32(ctx, -1);
    } else {
        index = JS_GetProperty(ctx, result, JS_ATOM_index);
        JS_FreeValue(ctx, result);
        return index;
    }

exception:
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);
    JS_FreeValue(ctx, previousLastIndex);
    return JS_EXCEPTION;
}